

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddFile<google::protobuf::FileDescriptorProto>
          (DescriptorIndex *this,FileDescriptorProto *file,Value value)

{
  void **ppvVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  DescriptorProto *message_type;
  FieldDescriptorProto *field;
  bool bVar6;
  long *plVar7;
  long lVar8;
  undefined8 *puVar9;
  Rep *pRVar10;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_02;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_03;
  RepeatedPtrField<google::protobuf::DescriptorProto> *pRVar11;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *pRVar12;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *pRVar13;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *pRVar14;
  int *piVar15;
  string_view symbol;
  string_view filename;
  string_view symbol_00;
  string_view symbol_01;
  string_view filename_00;
  string_view symbol_02;
  string_view str;
  string_view str_00;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  _Alloc_hider local_68;
  undefined1 local_60 [24];
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>,_bool>
  local_48;
  
  local_78 = (undefined1  [8])value.first;
  local_70._M_p._0_4_ = value.second;
  local_60._0_8_ = 0;
  local_60[8] = '\0';
  local_68._M_p = local_60 + 8;
  std::
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
  ::emplace_back<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>
            (&this->all_values_,(EncodedEntry *)local_78);
  if (local_68._M_p != local_60 + 8) {
    operator_delete(local_68._M_p,CONCAT71(local_60._9_7_,local_60[8]) + 1);
  }
  plVar7 = (long *)((ulong)(file->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  lVar4 = *plVar7;
  lVar5 = plVar7[1];
  if (lVar5 != 0) {
    lVar8 = 0;
    do {
      bVar2 = *(byte *)(lVar4 + lVar8);
      if ((((bVar2 != 0x2e) && (bVar2 != 0x5f)) && ((byte)(bVar2 - 0x3a) < 0xf6)) &&
         ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  ((LogMessage *)local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x29b);
        str_00._M_str = "Invalid package name: ";
        str_00._M_len = 0x16;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)local_78,str_00);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)local_78,
                   (string *)
                   ((ulong)(file->field_0)._impl_.package_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
        goto LAB_001b5e1f;
      }
      lVar8 = lVar8 + 1;
    } while (lVar5 != lVar8);
  }
  local_78 = (undefined1  [8])&local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,lVar4,lVar5 + lVar4);
  std::__cxx11::string::operator=
            ((string *)
             &(this->all_values_).
              super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].encoded_package,(string *)local_78);
  if (local_78 != (undefined1  [8])&local_68) {
    operator_delete((void *)local_78,(ulong)(local_68._M_p + 1));
  }
  local_78._0_4_ =
       (int)((ulong)((long)(this->all_values_).
                           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->all_values_).
                          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 + -1;
  plVar7 = (long *)((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  lVar4 = *plVar7;
  local_70._M_p = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,lVar4,plVar7[1] + lVar4);
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>
  ::
  insert_unique<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>
            (&local_48,&this->by_name_,(FileEntry *)local_78,(FileEntry *)local_78);
  if (local_48.second == true) {
    bVar6 = std::
            binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>,std::__cxx11::string,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                      ((this->by_name_flat_).
                       super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->by_name_flat_).
                       super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
                       (this->by_name_).
                       super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                       .
                       super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                       .tree_.rightmost_.
                       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                       .
                       super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>::checked_compare,_0UL,_false>
                       .value.
                       super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_true>
                       .super_FileCompare.index);
    if (local_70._M_p != local_60) {
      operator_delete(local_70._M_p,local_60._0_8_ + 1);
    }
    if (!bVar6) {
      this_00 = &(file->field_0)._impl_.message_type_;
      pRVar11 = this_00;
      if ((*(byte *)((long)&file->field_0 + 0x20) & 1) != 0) {
        pRVar10 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
        pRVar11 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar10->elements;
        if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
          pRVar10 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
          this_00 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)pRVar10->elements;
        }
      }
      iVar3 = *(int *)((long)&file->field_0 + 0x28);
      while( true ) {
        if (pRVar11 ==
            (RepeatedPtrField<google::protobuf::DescriptorProto> *)
            (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar3)) {
          this_01 = &(file->field_0)._impl_.enum_type_;
          pRVar12 = this_01;
          if ((*(byte *)((long)&file->field_0 + 0x38) & 1) != 0) {
            pRVar10 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
            pRVar12 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)pRVar10->elements;
            if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
              pRVar10 = internal::RepeatedPtrFieldBase::rep(&this_01->super_RepeatedPtrFieldBase);
              this_01 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)pRVar10->elements
              ;
            }
          }
          iVar3 = *(int *)((long)&file->field_0 + 0x40);
          for (; pRVar12 !=
                 (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
                 (&(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar3);
              pRVar12 = (RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)
                        &(pRVar12->super_RepeatedPtrFieldBase).current_size_) {
            puVar9 = (undefined8 *)
                     (*(ulong *)((long)(pRVar12->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                                0x60) & 0xfffffffffffffffc);
            symbol_00._M_str = (char *)*puVar9;
            symbol_00._M_len = puVar9[1];
            bVar6 = AddSymbol(this,symbol_00);
            if (!bVar6) {
              return false;
            }
          }
          this_02 = &(file->field_0)._impl_.extension_;
          pRVar13 = this_02;
          if ((*(byte *)((long)&file->field_0 + 0x68) & 1) != 0) {
            pRVar10 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
            pRVar13 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)pRVar10->elements;
            if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
              pRVar10 = internal::RepeatedPtrFieldBase::rep(&this_02->super_RepeatedPtrFieldBase);
              this_02 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                        pRVar10->elements;
            }
          }
          iVar3 = *(int *)((long)&file->field_0 + 0x70);
          while( true ) {
            if (pRVar13 ==
                (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                (&(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar3)) {
              this_03 = &(file->field_0)._impl_.service_;
              pRVar14 = this_03;
              if ((*(byte *)((long)&file->field_0 + 0x50) & 1) != 0) {
                pRVar10 = internal::RepeatedPtrFieldBase::rep(&this_03->super_RepeatedPtrFieldBase);
                pRVar14 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
                          pRVar10->elements;
                if (((ulong)(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
                  pRVar10 = internal::RepeatedPtrFieldBase::rep
                                      (&this_03->super_RepeatedPtrFieldBase);
                  this_03 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)
                            pRVar10->elements;
                }
              }
              ppvVar1 = &(this_03->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
                        *(int *)((long)&file->field_0 + 0x58);
              if (pRVar14 == (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)ppvVar1)
              {
                return true;
              }
              do {
                piVar15 = &(pRVar14->super_RepeatedPtrFieldBase).current_size_;
                puVar9 = (undefined8 *)
                         (*(ulong *)((long)(pRVar14->super_RepeatedPtrFieldBase).tagged_rep_or_elem_
                                    + 0x30) & 0xfffffffffffffffc);
                symbol_02._M_str = (char *)*puVar9;
                symbol_02._M_len = puVar9[1];
                bVar6 = AddSymbol(this,symbol_02);
                if (!bVar6) {
                  return bVar6;
                }
                pRVar14 = (RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *)piVar15;
              } while ((void **)piVar15 != ppvVar1);
              return bVar6;
            }
            field = (FieldDescriptorProto *)
                    (pRVar13->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
            puVar9 = (undefined8 *)
                     ((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
            symbol_01._M_str = (char *)*puVar9;
            symbol_01._M_len = puVar9[1];
            bVar6 = AddSymbol(this,symbol_01);
            if (!bVar6) {
              return false;
            }
            puVar9 = (undefined8 *)
                     ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
            filename_00._M_str = (char *)*puVar9;
            filename_00._M_len = puVar9[1];
            bVar6 = AddExtension<google::protobuf::FieldDescriptorProto>(this,filename_00,field);
            if (!bVar6) break;
            pRVar13 = (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)
                      &(pRVar13->super_RepeatedPtrFieldBase).current_size_;
          }
          return false;
        }
        message_type = (DescriptorProto *)(pRVar11->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
        puVar9 = (undefined8 *)
                 ((ulong)(message_type->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
        ;
        symbol._M_str = (char *)*puVar9;
        symbol._M_len = puVar9[1];
        bVar6 = AddSymbol(this,symbol);
        if (!bVar6) {
          return false;
        }
        puVar9 = (undefined8 *)
                 ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
        filename._M_str = (char *)*puVar9;
        filename._M_len = puVar9[1];
        bVar6 = AddNestedExtensions<google::protobuf::DescriptorProto>(this,filename,message_type);
        if (!bVar6) break;
        pRVar11 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)
                  &(pRVar11->super_RepeatedPtrFieldBase).current_size_;
      }
      return false;
    }
  }
  else if (local_70._M_p != local_60) {
    operator_delete(local_70._M_p,local_60._0_8_ + 1);
  }
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            ((LogMessage *)local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
             ,0x2a6);
  str._M_str = "File already exists in database: ";
  str._M_len = 0x21;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            ((LogMessage *)local_78,str);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            ((LogMessage *)local_78,
             (string *)((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
LAB_001b5e1f:
  absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)local_78);
  return false;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddFile(const FileProto& file,
                                                         Value value) {
  // We push `value` into the array first. This is important because the AddXXX
  // functions below will expect it to be there.
  all_values_.push_back({value.first, value.second, {}});

  if (!ValidateSymbolName(file.package())) {
    ABSL_LOG(ERROR) << "Invalid package name: " << file.package();
    return false;
  }
  all_values_.back().encoded_package = EncodeString(file.package());

  if (!by_name_
           .insert({static_cast<int>(all_values_.size() - 1),
                    EncodeString(file.name())})
           .second ||
      std::binary_search(by_name_flat_.begin(), by_name_flat_.end(),
                         file.name(), by_name_.key_comp())) {
    ABSL_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  for (const auto& message_type : file.message_type()) {
    if (!AddSymbol(message_type.name())) return false;
    if (!AddNestedExtensions(file.name(), message_type)) return false;
  }
  for (const auto& enum_type : file.enum_type()) {
    if (!AddSymbol(enum_type.name())) return false;
  }
  for (const auto& extension : file.extension()) {
    if (!AddSymbol(extension.name())) return false;
    if (!AddExtension(file.name(), extension)) return false;
  }
  for (const auto& service : file.service()) {
    if (!AddSymbol(service.name())) return false;
  }

  return true;
}